

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O1

bool dxil_spv::emit_check_access_fully_mapped_instruction(Impl *impl,CallInst *instruction)

{
  Id arg;
  Builder *pBVar1;
  Operation *this;
  Value *value;
  Capability local_1c;
  
  pBVar1 = Converter::Impl::builder(impl);
  local_1c = CapabilitySparseResidency;
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&pBVar1->capabilities,&local_1c);
  this = Converter::Impl::allocate(impl,OpImageSparseTexelsResident,(Value *)instruction);
  value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  arg = Converter::Impl::get_id_for_value(impl,value,0);
  Operation::add_id(this,arg);
  Converter::Impl::add(impl,this,false);
  return true;
}

Assistant:

bool emit_check_access_fully_mapped_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	builder.addCapability(spv::CapabilitySparseResidency);
	auto *op = impl.allocate(spv::OpImageSparseTexelsResident, instruction);
	op->add_id(impl.get_id_for_value(instruction->getOperand(1)));
	impl.add(op);
	return true;
}